

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O0

void __thiscall AVavoomLightColor::BeginPlay(AVavoomLightColor *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int local_28;
  int iStack_24;
  int l_args [5];
  AVavoomLightColor *this_local;
  
  uVar1 = *(undefined8 *)(this->super_AVavoomLight).super_ADynamicLight.super_AActor.args;
  uVar2 = *(undefined8 *)((this->super_AVavoomLight).super_ADynamicLight.super_AActor.args + 2);
  memset((this->super_AVavoomLight).super_ADynamicLight.super_AActor.args,0,0x14);
  local_28 = (int)uVar1;
  (this->super_AVavoomLight).super_ADynamicLight.m_Radius[0] = local_28 << 2;
  (this->super_AVavoomLight).super_ADynamicLight.super_AActor.args[0] = (int)((long)uVar1 >> 0x21);
  l_args[0] = (int)uVar2;
  (this->super_AVavoomLight).super_ADynamicLight.super_AActor.args[1] = l_args[0] >> 1;
  (this->super_AVavoomLight).super_ADynamicLight.super_AActor.args[2] = (int)((long)uVar2 >> 0x21);
  AVavoomLight::BeginPlay(&this->super_AVavoomLight);
  return;
}

Assistant:

void AVavoomLightColor::BeginPlay ()
{
	int l_args[5];
	memcpy(l_args, args, sizeof(l_args));
	memset(args, 0, sizeof(args));
	m_Radius[0] = l_args[0] * 4;
	args[LIGHT_RED] = l_args[1] >> 1;
	args[LIGHT_GREEN] = l_args[2] >> 1;
	args[LIGHT_BLUE] = l_args[3] >> 1;

	Super::BeginPlay();
}